

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::to_buffer_size_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,uint32_t id)

{
  char *c;
  long lVar1;
  _Alloc_hider _Var2;
  long *plVar3;
  size_type *psVar4;
  string expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> array_expr;
  string local_a0;
  string local_80;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  CompilerGLSL::to_expression_abi_cxx11_(&local_a0,&this->super_CompilerGLSL,id,true);
  lVar1 = ::std::__cxx11::string::find((char)&local_a0,0x5b);
  if (local_a0._M_string_length < 3) {
LAB_002cfaff:
    if (local_a0._M_string_length == 0) goto LAB_002cfb17;
  }
  else if ((*local_a0._M_dataplus._M_p == '(') && (local_a0._M_dataplus._M_p[1] == '*')) {
    CompilerGLSL::address_of_expression(&local_80,&this->super_CompilerGLSL,&local_a0);
    ::std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    goto LAB_002cfaff;
  }
  _Var2._M_p = local_a0._M_dataplus._M_p;
  do {
    if (*_Var2._M_p == '.') {
      *_Var2._M_p = '_';
    }
    _Var2._M_p = _Var2._M_p + 1;
  } while (_Var2._M_p != local_a0._M_dataplus._M_p + local_a0._M_string_length);
LAB_002cfb17:
  if (lVar1 == -1) {
    ::std::operator+(__return_storage_ptr__,&local_a0,&this->buffer_size_name_suffix);
  }
  else {
    ::std::__cxx11::string::substr((ulong)&local_80,(ulong)&local_a0);
    ::std::__cxx11::string::substr((ulong)local_60,(ulong)&local_a0);
    ::std::operator+(&local_40,&local_80,&this->buffer_size_name_suffix);
    plVar3 = (long *)::std::__cxx11::string::_M_append((char *)&local_40,(ulong)local_60[0]);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar4) {
      lVar1 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if (local_60[0] != local_50) {
      operator_delete(local_60[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_buffer_size_expression(uint32_t id)
{
	auto expr = to_expression(id);
	auto index = expr.find_first_of('[');

	// This is quite crude, but we need to translate the reference name (*spvDescriptorSetN.name) to
	// the pointer expression spvDescriptorSetN.name to make a reasonable expression here.
	// This only happens if we have argument buffers and we are using OpArrayLength on a lone SSBO in that set.
	if (expr.size() >= 3 && expr[0] == '(' && expr[1] == '*')
		expr = address_of_expression(expr);

	// If a buffer is part of an argument buffer translate this to a legal identifier.
	for (auto &c : expr)
		if (c == '.')
			c = '_';

	if (index == string::npos)
		return expr + buffer_size_name_suffix;
	else
	{
		auto buffer_expr = expr.substr(0, index);
		auto array_expr = expr.substr(index);
		return buffer_expr + buffer_size_name_suffix + array_expr;
	}
}